

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateUtils.cpp
# Opt level: O0

time_point
ApprovalTests::DateUtils::createUtcDateTime
          (int year,int month,int day,int hour,int minute,int second)

{
  time_point tVar1;
  time_t tt;
  tm timeinfo;
  tm *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffc0;
  
  createTm(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
           in_stack_ffffffffffffffa8,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
           in_stack_ffffffffffffffc0);
  toUtc(in_stack_ffffffffffffffa0);
  tVar1 = ::std::chrono::_V2::system_clock::from_time_t
                    (CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  return (duration)tVar1.__d.__r;
}

Assistant:

std::chrono::system_clock::time_point
    DateUtils::createUtcDateTime(int year,
                                 int month,
                                 int day,
                                 int hour,
                                 int minute,
                                 int second) // these are UTC values
    {
        tm timeinfo = createTm(year, month, day, hour, minute, second);
        time_t tt = toUtc(timeinfo);
        return std::chrono::system_clock::from_time_t(tt);
    }